

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

int mg_node_equal(mg_node *lhs,mg_node *rhs)

{
  uint uVar1;
  mg_string **ppmVar2;
  mg_string **ppmVar3;
  int iVar4;
  mg_string *pmVar5;
  mg_string *pmVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  if ((lhs->id != rhs->id) || (uVar1 = lhs->label_count, uVar1 != rhs->label_count)) {
    return 0;
  }
  bVar9 = uVar1 != 0;
  if (bVar9) {
    ppmVar2 = lhs->labels;
    ppmVar3 = rhs->labels;
    pmVar5 = *ppmVar2;
    pmVar6 = *ppmVar3;
    uVar7 = pmVar5->size;
    if (uVar7 == pmVar6->size) {
      uVar8 = 1;
      do {
        iVar4 = bcmp(pmVar5->data,pmVar6->data,(ulong)uVar7);
        if (iVar4 != 0) break;
        if (uVar1 == uVar8) goto LAB_0010b6f9;
        bVar9 = uVar8 <= uVar1 && uVar1 != uVar8;
        pmVar5 = ppmVar2[uVar8];
        pmVar6 = ppmVar3[uVar8];
        uVar7 = pmVar5->size;
        uVar8 = uVar8 + 1;
      } while (uVar7 == pmVar6->size);
    }
    if (bVar9) {
      return 0;
    }
  }
LAB_0010b6f9:
  iVar4 = mg_map_equal(lhs->properties,rhs->properties);
  return iVar4;
}

Assistant:

int mg_node_equal(const mg_node *lhs, const mg_node *rhs) {
  if (lhs->id != rhs->id) {
    return 0;
  }
  if (lhs->label_count != rhs->label_count) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->label_count; ++i) {
    if (!mg_string_equal(lhs->labels[i], rhs->labels[i])) {
      return 0;
    }
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}